

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O3

void sha256_ni_write(BinarySink *bs,void *vp,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var3;
  ulong __n;
  __m128i *block;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  if (len != 0) {
    do {
      __n = 0x40 - (long)bs[-1].write;
      if (len < __n) {
        __n = len;
      }
      memcpy(bs[-1].write + -0x58 + (long)&bs->write,vp,__n);
      p_Var3 = bs[-1].write;
      bs[-1].write = p_Var3 + __n;
      bs[-1].writefmtv = bs[-1].writefmtv + __n;
      if (p_Var3 + __n == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x40) {
        bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
        auVar1._0_8_ = bs[-5].write;
        auVar1._8_8_ = bs[-5].writefmtv;
        auVar2 = *(undefined1 (*) [16])&bs[-5].binarysink_;
        auVar33._0_8_ = bs[-4].writefmtv;
        auVar33._8_8_ = bs[-4].binarysink_;
        auVar37 = pshufb(auVar33,_DAT_00141340);
        auVar36._0_4_ = auVar37._0_4_ + 0x428a2f98;
        auVar36._4_4_ = auVar37._4_4_ + 0x71374491;
        auVar36._8_4_ = auVar37._8_4_ + -0x4a3f0431;
        auVar36._12_4_ = auVar37._12_4_ + -0x164a245b;
        auVar33 = sha256rnds2_sha(auVar2,auVar1,auVar36);
        auVar38._4_4_ = auVar36._12_4_;
        auVar38._0_4_ = auVar36._8_4_;
        auVar38._8_4_ = auVar36._0_4_;
        auVar38._12_4_ = auVar36._0_4_;
        auVar34 = sha256rnds2_sha(auVar1,auVar33,auVar38);
        auVar35._0_8_ = bs[-3].write;
        auVar35._8_8_ = bs[-3].writefmtv;
        auVar41 = pshufb(auVar35,_DAT_00141340);
        auVar42._0_4_ = auVar41._0_4_ + 0x3956c25b;
        auVar42._4_4_ = auVar41._4_4_ + 0x59f111f1;
        auVar42._8_4_ = auVar41._8_4_ + -0x6dc07d5c;
        auVar42._12_4_ = auVar41._12_4_ + -0x54e3a12b;
        auVar33 = sha256rnds2_sha(auVar33,auVar34,auVar42);
        auVar45._4_4_ = auVar42._12_4_;
        auVar45._0_4_ = auVar42._8_4_;
        auVar45._8_4_ = auVar42._0_4_;
        auVar45._12_4_ = auVar42._0_4_;
        auVar35 = sha256rnds2_sha(auVar34,auVar33,auVar45);
        auVar38 = sha256msg1_sha(auVar37,auVar41);
        auVar45 = pshufb(*(undefined1 (*) [16])&bs[-3].binarysink_,_DAT_00141340);
        auVar37._0_4_ = auVar45._0_4_ + -0x27f85568;
        auVar37._4_4_ = auVar45._4_4_ + 0x12835b01;
        auVar37._8_4_ = auVar45._8_4_ + 0x243185be;
        auVar37._12_4_ = auVar45._12_4_ + 0x550c7dc3;
        auVar33 = sha256rnds2_sha(auVar33,auVar35,auVar37);
        auVar4._4_4_ = auVar37._12_4_;
        auVar4._0_4_ = auVar37._8_4_;
        auVar4._8_4_ = auVar37._0_4_;
        auVar4._12_4_ = auVar37._0_4_;
        auVar36 = sha256rnds2_sha(auVar35,auVar33,auVar4);
        auVar42 = sha256msg1_sha(auVar41,auVar45);
        auVar34._0_8_ = bs[-2].writefmtv;
        auVar34._8_8_ = bs[-2].binarysink_;
        auVar37 = pshufb(auVar34,_DAT_00141340);
        auVar41._0_4_ = auVar37._0_4_ + 0x72be5d74;
        auVar41._4_4_ = auVar37._4_4_ + -0x7f214e02;
        auVar41._8_4_ = auVar37._8_4_ + -0x6423f959;
        auVar41._12_4_ = auVar37._12_4_ + -0x3e640e8c;
        auVar35 = sha256rnds2_sha(auVar33,auVar36,auVar41);
        auVar29._0_4_ = auVar45._4_4_ + auVar38._0_4_;
        auVar29._4_4_ = auVar45._8_4_ + auVar38._4_4_;
        auVar29._8_4_ = auVar45._12_4_ + auVar38._8_4_;
        auVar29._12_4_ = auVar37._0_4_ + auVar38._12_4_;
        auVar33 = sha256msg2_sha(auVar29,auVar37);
        auVar5._4_4_ = auVar41._12_4_;
        auVar5._0_4_ = auVar41._8_4_;
        auVar5._8_4_ = auVar41._0_4_;
        auVar5._12_4_ = auVar41._0_4_;
        auVar34 = sha256rnds2_sha(auVar36,auVar35,auVar5);
        auVar38 = sha256msg1_sha(auVar45,auVar37);
        auVar6._0_4_ = auVar33._0_4_ + -0x1b64963f;
        auVar6._4_4_ = auVar33._4_4_ + -0x1041b87a;
        auVar6._8_4_ = auVar33._8_4_ + 0xfc19dc6;
        auVar6._12_4_ = auVar33._12_4_ + 0x240ca1cc;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar6);
        auVar39._0_4_ = auVar37._4_4_ + auVar42._0_4_;
        auVar39._4_4_ = auVar37._8_4_ + auVar42._4_4_;
        auVar39._8_4_ = auVar37._12_4_ + auVar42._8_4_;
        auVar39._12_4_ = auVar33._0_4_ + auVar42._12_4_;
        auVar36 = sha256msg2_sha(auVar39,auVar33);
        auVar7._4_4_ = auVar6._12_4_;
        auVar7._0_4_ = auVar6._8_4_;
        auVar7._8_4_ = auVar6._0_4_;
        auVar7._12_4_ = auVar6._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar7);
        auVar42 = sha256msg1_sha(auVar37,auVar33);
        auVar8._0_4_ = auVar36._0_4_ + 0x2de92c6f;
        auVar8._4_4_ = auVar36._4_4_ + 0x4a7484aa;
        auVar8._8_4_ = auVar36._8_4_ + 0x5cb0a9dc;
        auVar8._12_4_ = auVar36._12_4_ + 0x76f988da;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar8);
        auVar43._0_4_ = auVar33._4_4_ + auVar38._0_4_;
        auVar43._4_4_ = auVar33._8_4_ + auVar38._4_4_;
        auVar43._8_4_ = auVar33._12_4_ + auVar38._8_4_;
        auVar43._12_4_ = auVar36._0_4_ + auVar38._12_4_;
        auVar38 = sha256msg2_sha(auVar43,auVar36);
        auVar9._4_4_ = auVar8._12_4_;
        auVar9._0_4_ = auVar8._8_4_;
        auVar9._8_4_ = auVar8._0_4_;
        auVar9._12_4_ = auVar8._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar9);
        auVar33 = sha256msg1_sha(auVar33,auVar36);
        auVar10._0_4_ = auVar38._0_4_ + -0x67c1aeae;
        auVar10._4_4_ = auVar38._4_4_ + -0x57ce3993;
        auVar10._8_4_ = auVar38._8_4_ + -0x4ffcd838;
        auVar10._12_4_ = auVar38._12_4_ + -0x40a68039;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar10);
        auVar46._0_4_ = auVar36._4_4_ + auVar42._0_4_;
        auVar46._4_4_ = auVar36._8_4_ + auVar42._4_4_;
        auVar46._8_4_ = auVar36._12_4_ + auVar42._8_4_;
        auVar46._12_4_ = auVar38._0_4_ + auVar42._12_4_;
        auVar42 = sha256msg2_sha(auVar46,auVar38);
        auVar11._4_4_ = auVar10._12_4_;
        auVar11._0_4_ = auVar10._8_4_;
        auVar11._8_4_ = auVar10._0_4_;
        auVar11._12_4_ = auVar10._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar11);
        auVar36 = sha256msg1_sha(auVar36,auVar38);
        auVar12._0_4_ = auVar42._0_4_ + -0x391ff40d;
        auVar12._4_4_ = auVar42._4_4_ + -0x2a586eb9;
        auVar12._8_4_ = auVar42._8_4_ + 0x6ca6351;
        auVar12._12_4_ = auVar42._12_4_ + 0x14292967;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar12);
        auVar48._0_4_ = auVar38._4_4_ + auVar33._0_4_;
        auVar48._4_4_ = auVar38._8_4_ + auVar33._4_4_;
        auVar48._8_4_ = auVar38._12_4_ + auVar33._8_4_;
        auVar48._12_4_ = auVar42._0_4_ + auVar33._12_4_;
        auVar45 = sha256msg2_sha(auVar48,auVar42);
        auVar13._4_4_ = auVar12._12_4_;
        auVar13._0_4_ = auVar12._8_4_;
        auVar13._8_4_ = auVar12._0_4_;
        auVar13._12_4_ = auVar12._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar13);
        auVar38 = sha256msg1_sha(auVar38,auVar42);
        auVar14._0_4_ = auVar45._0_4_ + 0x27b70a85;
        auVar14._4_4_ = auVar45._4_4_ + 0x2e1b2138;
        auVar14._8_4_ = auVar45._8_4_ + 0x4d2c6dfc;
        auVar14._12_4_ = auVar45._12_4_ + 0x53380d13;
        auVar33 = sha256rnds2_sha(auVar35,auVar34,auVar14);
        auVar50._0_4_ = auVar42._4_4_ + auVar36._0_4_;
        auVar50._4_4_ = auVar42._8_4_ + auVar36._4_4_;
        auVar50._8_4_ = auVar42._12_4_ + auVar36._8_4_;
        auVar50._12_4_ = auVar45._0_4_ + auVar36._12_4_;
        auVar37 = sha256msg2_sha(auVar50,auVar45);
        auVar15._4_4_ = auVar14._12_4_;
        auVar15._0_4_ = auVar14._8_4_;
        auVar15._8_4_ = auVar14._0_4_;
        auVar15._12_4_ = auVar14._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar33,auVar15);
        auVar36 = sha256msg1_sha(auVar42,auVar45);
        auVar16._0_4_ = auVar37._0_4_ + 0x650a7354;
        auVar16._4_4_ = auVar37._4_4_ + 0x766a0abb;
        auVar16._8_4_ = auVar37._8_4_ + -0x7e3d36d2;
        auVar16._12_4_ = auVar37._12_4_ + -0x6d8dd37b;
        auVar35 = sha256rnds2_sha(auVar33,auVar34,auVar16);
        auVar30._0_4_ = auVar45._4_4_ + auVar38._0_4_;
        auVar30._4_4_ = auVar45._8_4_ + auVar38._4_4_;
        auVar30._8_4_ = auVar45._12_4_ + auVar38._8_4_;
        auVar30._12_4_ = auVar37._0_4_ + auVar38._12_4_;
        auVar33 = sha256msg2_sha(auVar30,auVar37);
        auVar17._4_4_ = auVar16._12_4_;
        auVar17._0_4_ = auVar16._8_4_;
        auVar17._8_4_ = auVar16._0_4_;
        auVar17._12_4_ = auVar16._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar17);
        auVar38 = sha256msg1_sha(auVar45,auVar37);
        auVar18._0_4_ = auVar33._0_4_ + -0x5d40175f;
        auVar18._4_4_ = auVar33._4_4_ + -0x57e599b5;
        auVar18._8_4_ = auVar33._8_4_ + -0x3db47490;
        auVar18._12_4_ = auVar33._12_4_ + -0x3893ae5d;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar18);
        auVar40._0_4_ = auVar37._4_4_ + auVar36._0_4_;
        auVar40._4_4_ = auVar37._8_4_ + auVar36._4_4_;
        auVar40._8_4_ = auVar37._12_4_ + auVar36._8_4_;
        auVar40._12_4_ = auVar33._0_4_ + auVar36._12_4_;
        auVar36 = sha256msg2_sha(auVar40,auVar33);
        auVar19._4_4_ = auVar18._12_4_;
        auVar19._0_4_ = auVar18._8_4_;
        auVar19._8_4_ = auVar18._0_4_;
        auVar19._12_4_ = auVar18._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar19);
        auVar45 = sha256msg1_sha(auVar37,auVar33);
        auVar20._0_4_ = auVar36._0_4_ + -0x2e6d17e7;
        auVar20._4_4_ = auVar36._4_4_ + -0x2966f9dc;
        auVar20._8_4_ = auVar36._8_4_ + -0xbf1ca7b;
        auVar20._12_4_ = auVar36._12_4_ + 0x106aa070;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar20);
        auVar47._0_4_ = auVar33._4_4_ + auVar38._0_4_;
        auVar47._4_4_ = auVar33._8_4_ + auVar38._4_4_;
        auVar47._8_4_ = auVar33._12_4_ + auVar38._8_4_;
        auVar47._12_4_ = auVar36._0_4_ + auVar38._12_4_;
        auVar42 = sha256msg2_sha(auVar47,auVar36);
        auVar21._4_4_ = auVar20._12_4_;
        auVar21._0_4_ = auVar20._8_4_;
        auVar21._8_4_ = auVar20._0_4_;
        auVar21._12_4_ = auVar20._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar21);
        auVar33 = sha256msg1_sha(auVar33,auVar36);
        auVar44._0_4_ = auVar36._4_4_ + auVar45._0_4_;
        auVar44._4_4_ = auVar36._8_4_ + auVar45._4_4_;
        auVar44._8_4_ = auVar36._12_4_ + auVar45._8_4_;
        auVar44._12_4_ = auVar42._0_4_ + auVar45._12_4_;
        auVar38 = sha256msg2_sha(auVar44,auVar42);
        auVar36 = sha256msg1_sha(auVar36,auVar42);
        auVar22._0_4_ = auVar42._0_4_ + 0x19a4c116;
        auVar22._4_4_ = auVar42._4_4_ + 0x1e376c08;
        auVar22._8_4_ = auVar42._8_4_ + 0x2748774c;
        auVar22._12_4_ = auVar42._12_4_ + 0x34b0bcb5;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar22);
        auVar23._4_4_ = auVar22._12_4_;
        auVar23._0_4_ = auVar22._8_4_;
        auVar23._8_4_ = auVar22._0_4_;
        auVar23._12_4_ = auVar22._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar23);
        auVar49._0_4_ = auVar42._4_4_ + auVar33._0_4_;
        auVar49._4_4_ = auVar42._8_4_ + auVar33._4_4_;
        auVar49._8_4_ = auVar42._12_4_ + auVar33._8_4_;
        auVar49._12_4_ = auVar38._0_4_ + auVar33._12_4_;
        auVar42 = sha256msg2_sha(auVar49,auVar38);
        auVar24._0_4_ = auVar38._0_4_ + 0x391c0cb3;
        auVar24._4_4_ = auVar38._4_4_ + 0x4ed8aa4a;
        auVar24._8_4_ = auVar38._8_4_ + 0x5b9cca4f;
        auVar24._12_4_ = auVar38._12_4_ + 0x682e6ff3;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar24);
        auVar25._4_4_ = auVar24._12_4_;
        auVar25._0_4_ = auVar24._8_4_;
        auVar25._8_4_ = auVar24._0_4_;
        auVar25._12_4_ = auVar24._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar25);
        auVar31._0_4_ = auVar38._4_4_ + auVar36._0_4_;
        auVar31._4_4_ = auVar38._8_4_ + auVar36._4_4_;
        auVar31._8_4_ = auVar38._12_4_ + auVar36._8_4_;
        auVar31._12_4_ = auVar42._0_4_ + auVar36._12_4_;
        auVar33 = sha256msg2_sha(auVar31,auVar42);
        auVar26._0_4_ = auVar42._0_4_ + 0x748f82ee;
        auVar26._4_4_ = auVar42._4_4_ + 0x78a5636f;
        auVar26._8_4_ = auVar42._8_4_ + -0x7b3787ec;
        auVar26._12_4_ = auVar42._12_4_ + -0x7338fdf8;
        auVar35 = sha256rnds2_sha(auVar35,auVar34,auVar26);
        auVar32._0_4_ = auVar33._0_4_ + -0x6f410006;
        auVar32._4_4_ = auVar33._4_4_ + -0x5baf9315;
        auVar32._8_4_ = auVar33._8_4_ + -0x41065c09;
        auVar32._12_4_ = auVar33._12_4_ + -0x398e870e;
        auVar27._4_4_ = auVar26._12_4_;
        auVar27._0_4_ = auVar26._8_4_;
        auVar27._8_4_ = auVar26._0_4_;
        auVar27._12_4_ = auVar26._0_4_;
        auVar34 = sha256rnds2_sha(auVar34,auVar35,auVar27);
        auVar33 = sha256rnds2_sha(auVar35,auVar34,auVar32);
        auVar28._4_4_ = auVar32._12_4_;
        auVar28._0_4_ = auVar32._8_4_;
        auVar28._8_4_ = auVar32._0_4_;
        auVar28._12_4_ = auVar32._0_4_;
        auVar35 = sha256rnds2_sha(auVar34,auVar33,auVar28);
        *(int *)&bs[-5].write = auVar35._0_4_ + (int)auVar1._0_8_;
        *(int *)((long)&bs[-5].write + 4) = auVar35._4_4_ + (int)((ulong)auVar1._0_8_ >> 0x20);
        *(int *)&bs[-5].writefmtv = auVar35._8_4_ + (int)auVar1._8_8_;
        *(int *)((long)&bs[-5].writefmtv + 4) = auVar35._12_4_ + (int)((ulong)auVar1._8_8_ >> 0x20);
        *(int *)&bs[-5].binarysink_ = auVar33._0_4_ + auVar2._0_4_;
        *(int *)((long)&bs[-5].binarysink_ + 4) = auVar33._4_4_ + auVar2._4_4_;
        *(int *)&bs[-4].write = auVar33._8_4_ + auVar2._8_4_;
        *(int *)((long)&bs[-4].write + 4) = auVar33._12_4_ + auVar2._12_4_;
      }
      vp = (void *)((long)vp + __n);
      len = len - __n;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha256_ni_write(BinarySink *bs, const void *vp, size_t len)
{
    sha256_ni *s = BinarySink_DOWNCAST(bs, sha256_ni);

    while (len > 0)
        if (sha256_block_write(&s->blk, &vp, &len))
            sha256_ni_block(s->core, s->blk.block);
}